

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O1

DecodeStatus
decodeBDVAddr64Disp12Operand(MCInst *Inst,uint64_t Field,uint64_t Address,void *Decoder)

{
  DecodeStatus extraout_EAX;
  uint Reg;
  
  if ((Field >> 0xc & 0xf) == 0) {
    Reg = 0;
  }
  else {
    Reg = SystemZMC_GR64Regs[(uint)(Field >> 0xc) & 0xf];
  }
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateImm0(Inst,(ulong)((uint)Field & 0xfff));
  MCOperand_CreateReg0(Inst,SystemZMC_VR128Regs[Field >> 0x10]);
  return extraout_EAX;
}

Assistant:

static DecodeStatus decodeBDVAddr64Disp12Operand(MCInst *Inst, uint64_t Field,
		uint64_t Address, const void *Decoder)
{
	return decodeBDVAddr12Operand(Inst, Field, SystemZMC_GR64Regs);
}